

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O2

void __thiscall SymbolTableTree::~SymbolTableTree(SymbolTableTree *this)

{
  std::__cxx11::string::~string((string *)&this->current_table_name);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_>_>
  ::~vector(&this->m_table_tree);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

SymbolTableTree::~SymbolTableTree() {
}